

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double beta_cdf_inv(double cdf,double p,double q)

{
  bool bVar1;
  double y_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  __type _Var8;
  double local_d8;
  double yprev;
  double y;
  double xin;
  double w;
  double value;
  double tx;
  double t;
  double sq;
  double sae;
  double s;
  double r;
  double qq;
  double prev;
  double pp;
  bool indx;
  int iex;
  double h;
  double g;
  double fpu;
  double beta_log;
  double adj;
  double acu;
  double a;
  double q_local;
  double p_local;
  double cdf_local;
  
  y_00 = pow(10.0,-37.0);
  if (0.0 < p) {
    if (0.0 < q) {
      if ((cdf < 0.0) || (1.0 < cdf)) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  CDF < 0.0 or 1.0 < CDF\n");
        cdf_local = -1.0;
      }
      else if ((cdf != 0.0) || (NAN(cdf))) {
        if ((cdf != 1.0) || (NAN(cdf))) {
          bVar1 = 0.5 < cdf;
          r = q;
          prev = p;
          acu = cdf;
          if (bVar1) {
            acu = 1.0 - cdf;
            r = p;
            prev = q;
          }
          dVar2 = log(acu * acu);
          dVar2 = sqrt(-dVar2);
          dVar2 = dVar2 - (dVar2 * 0.27061 + 2.30753) / ((dVar2 * 0.04481 + 0.99229) * dVar2 + 1.0);
          if ((prev <= 1.0) || (r <= 1.0)) {
            dVar3 = 1.0 / (r * 9.0);
            dVar4 = sqrt(dVar3);
            _Var8 = std::pow<double,int>(dVar2 * dVar4 + (1.0 - dVar3),3);
            dVar2 = (r + r) * _Var8;
            if (0.0 < dVar2) {
              dVar2 = ((prev * 4.0 + r + r) - 2.0) / dVar2;
              if (1.0 < dVar2) {
                w = 1.0 - 2.0 / (dVar2 + 1.0);
              }
              else {
                dVar2 = log(acu * prev);
                w = exp((dVar2 + 0.0) / prev);
              }
            }
            else {
              dVar2 = log((1.0 - acu) * r);
              dVar2 = exp((dVar2 + 0.0) / r);
              w = 1.0 - dVar2;
            }
          }
          else {
            dVar3 = (dVar2 * dVar2 + -3.0) / 6.0;
            dVar4 = 1.0 / ((prev + prev) - 1.0);
            dVar5 = 1.0 / ((r + r) - 1.0);
            dVar6 = 2.0 / (dVar4 + dVar5);
            dVar7 = sqrt(dVar6 + dVar3);
            dVar2 = -(dVar5 - dVar4) * ((dVar3 + 0.8333333333333334) - 2.0 / (dVar6 * 3.0)) +
                    (dVar2 * dVar7) / dVar6;
            dVar2 = exp(dVar2 + dVar2);
            w = prev / (r * dVar2 + prev);
          }
          local_d8 = 0.0;
          t = 1.0;
          qq = 1.0;
          if (w < 0.0001) {
            w = 0.0001;
          }
          if (0.9999 < w) {
            w = 0.9999;
          }
          dVar2 = pow(acu,0.2);
          dVar2 = r8_max(((-5.0 / prev) / prev - 1.0 / dVar2) - 13.0,-37.0);
          _Var8 = std::pow<double,int>(10.0,(int)dVar2);
          dVar2 = w;
          do {
            w = dVar2;
            dVar2 = beta_inc(prev,r,w);
            dVar3 = log(w);
            dVar4 = log(1.0 - w);
            dVar3 = exp((1.0 - r) * dVar4 + (1.0 - prev) * dVar3 + 0.0);
            dVar3 = (dVar2 - acu) * dVar3;
            if (dVar3 * local_d8 <= 0.0) {
              qq = r8_max(t,y_00);
            }
            h = 1.0;
            while( true ) {
              while( true ) {
                dVar2 = h * dVar3;
                t = dVar2 * dVar2;
                if (((t < qq) && (dVar2 = w - dVar2, 0.0 <= dVar2)) && (dVar2 <= 1.0)) break;
                h = h / 3.0;
              }
              if (qq <= _Var8) {
                if (bVar1) {
                  w = 1.0 - w;
                }
                return w;
              }
              if (dVar3 * dVar3 <= _Var8) {
                if (bVar1) {
                  w = 1.0 - w;
                }
                return w;
              }
              if (((dVar2 != 0.0) || (NAN(dVar2))) && ((dVar2 != 1.0 || (NAN(dVar2))))) break;
              h = h / 3.0;
            }
            local_d8 = dVar3;
          } while ((dVar2 != w) || (NAN(dVar2) || NAN(w)));
          if (bVar1) {
            w = 1.0 - w;
          }
          cdf_local = w;
        }
        else {
          cdf_local = 1.0;
        }
      }
      else {
        cdf_local = 0.0;
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  Q <= 0.0\n");
      cdf_local = -1.0;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  P <= 0.0\n");
    cdf_local = -1.0;
  }
  return cdf_local;
}

Assistant:

double beta_cdf_inv ( double cdf, double p, double q )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF_INV inverts the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 April 2013
//
//  Author:
//
//    Original FORTRAN77 version by GW Cran, KJ Martin, GE Thomas.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    GW Cran, KJ Martin, GE Thomas,
//    Remark AS R19 and Algorithm AS 109:
//    A Remark on Algorithms AS 63: The Incomplete Beta Integral
//    and AS 64: Inverse of the Incomplete Beta Integeral,
//    Applied Statistics,
//    Volume 26, Number 1, 1977, pages 111-114.
//
//  Parameters:
//
//    Input, double CDF, the value of the incomplete Beta
//    function.  0 <= CDF <= 1.
//
//    Input, double P, Q, the parameters of the incomplete
//    Beta function.
//
//    Output, double BETA_CDF_INV, the argument of the Beta CDF which 
//    produces the value CDF.
//
//  Local Parameters:
//
//    Local, double SAE, the most negative decimal exponent
//    which does not cause an underflow.
//
{
  double a;
  double acu;
  double adj;
  double beta_log = 0.0;
  double fpu;
  double g;
  double h;
  int iex;
  bool indx;
  double pp;
  double prev;
  double qq;
  double r;
  double s;
  double sae = -37.0;
  double sq;
  double t;
  double tx;
  double value;
  double w;
  double xin;
  double y;
  double yprev;

  fpu = pow ( 10.0, sae );
//
//  Test for admissibility of parameters.
//
  if ( p <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  P <= 0.0\n";
    value = -1.0;
    return value;
  }

  if ( q <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  Q <= 0.0\n";
    value = -1.0;
    return value;
  }

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0.0 or 1.0 < CDF\n";
    value = -1.0;
    return value;
  }
//
//  Return immediately if the answer is easy.
//
  if ( cdf == 0.0 )
  {
    value = 0.0;
    return value;
  }
  if ( cdf == 1.0 )
  {
    value = 1.0;
    return value;
  }
//
//  Change tail if necessary.
//
  if ( 0.5 < cdf )
  {
    a = 1.0 - cdf;
    pp = q;
    qq = p;
    indx = true;
  }
  else
  {
    a = cdf;
    pp = p;
    qq = q;
    indx = false;
  }
//
//  Calculate the initial approximation.
//
  r = sqrt ( - log ( a * a ) );

  y = r - ( 2.30753 + 0.27061 * r ) 
    / ( 1.0 + ( 0.99229 + 0.04481 * r ) * r );

  if ( 1.0 < pp && 1.0 < qq )
  {
    r = ( y * y - 3.0 ) / 6.0;
    s = 1.0 / ( pp + pp - 1.0 );
    t = 1.0 / ( qq + qq - 1.0 );
    h = 2.0 / ( s + t );
    w = y * sqrt ( h + r ) / h - ( t - s ) 
      * ( r + 5.0 / 6.0 - 2.0 / ( 3.0 * h ) );
    value = pp / ( pp + qq * exp ( w + w ) );
  }
  else
  {
    r = qq + qq;
    t = 1.0 / ( 9.0 * qq );
    t = r * pow ( 1.0 - t + y * sqrt ( t ), 3 );

    if ( t <= 0.0 )
    {
      value = 1.0 - exp ( ( log ( ( 1.0 - a ) * qq ) + beta_log ) / qq );
    }
    else
    {
      t = ( 4.0 * pp + r - 2.0 ) / t;

      if ( t <= 1.0 )
      {
        value = exp ( ( log ( a * pp ) + beta_log ) / pp );
      }
      else
      {
        value = 1.0 - 2.0 / ( t + 1.0 );
      }
    }
  }
//
//  Solve for X by a modified Newton-Raphson method.
//
  r = 1.0 - pp;
  t = 1.0 - qq;
  yprev = 0.0;
  sq = 1.0;
  prev = 1.0;

  if ( value < 0.0001 )
  {
    value = 0.0001;
  }

  if ( 0.9999 < value )
  {
    value = 0.9999;
  }

  iex = r8_max ( - 5.0 / pp / pp - 1.0 / pow ( a, 0.2 ) - 13.0, sae );

  acu = pow ( 10.0, iex );

  for ( ; ; )
  {
    y = beta_inc ( pp, qq, value );

    xin = value;
    y = ( y - a ) * exp ( beta_log + r * log ( xin ) + t * log ( 1.0 - xin ) );

    if ( y * yprev <= 0.0 )
    {
      prev = r8_max ( sq, fpu );
    }

    g = 1.0;

    for ( ; ; )
    {
      for ( ; ; )
      {
        adj = g * y;
        sq = adj * adj;

        if ( sq < prev )
        {
          tx = value - adj;

          if ( 0.0 <= tx && tx <= 1.0 )
          {
            break;
          }
        }
        g = g / 3.0;
      }

      if ( prev <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( y * y <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( tx != 0.0 && tx != 1.0 )
      {
        break;
      }

      g = g / 3.0;
    }

    if ( tx == value )
    {
      break;
    }

    value = tx;
    yprev = y;
  }

  if ( indx )
  {
    value = 1.0 - value;
  }

  return value;
}